

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.h
# Opt level: O3

void __thiscall
google::protobuf::strings::CheckedArrayByteSink::~CheckedArrayByteSink(CheckedArrayByteSink *this)

{
  operator_delete(this);
  return;
}

Assistant:

class PROTOBUF_EXPORT CheckedArrayByteSink : public ByteSink {
 public:
  CheckedArrayByteSink(char* outbuf, size_t capacity);
  virtual void Append(const char* bytes, size_t n) override;

  // Returns the number of bytes actually written to the sink.
  size_t NumberOfBytesWritten() const { return size_; }

  // Returns true if any bytes were discarded, i.e., if there was an
  // attempt to write more than 'capacity' bytes.
  bool Overflowed() const { return overflowed_; }

 private:
  char* outbuf_;
  const size_t capacity_;
  size_t size_;
  bool overflowed_;
  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS(CheckedArrayByteSink);
}